

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

void __thiscall cmComputeLinkDepends::DisplayConstraintGraph(cmComputeLinkDepends *this)

{
  string_view sep;
  ostream *poVar1;
  ulong uVar2;
  pointer pcVar3;
  uint uVar4;
  ulong uVar5;
  string_view prefix;
  string_view suffix;
  ostringstream e;
  string local_1d8;
  undefined8 local_1b8;
  char *pcStack_1b0;
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  pcVar3 = (this->EntryConstraintGraph).
           super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
           super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->EntryConstraintGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar3) {
    uVar4 = 1;
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"item ",5);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," is [",5);
      poVar1 = operator<<(poVar1,&(this->EntryList).
                                  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar5].Item);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
      local_1b8 = 1;
      pcStack_1b0 = "\n";
      sep._M_str = "\n";
      sep._M_len = 1;
      prefix._M_str = "  item ";
      prefix._M_len = 7;
      suffix._M_str = " must follow it";
      suffix._M_len = 0xf;
      cmWrap<cmGraphEdgeList>(&local_1d8,prefix,pcVar3 + uVar5,suffix,sep);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (&local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      uVar5 = (ulong)uVar4;
      pcVar3 = (this->EntryConstraintGraph).
               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = ((long)(this->EntryConstraintGraph).
                     super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                     super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pcVar3 >> 3) * -0x5555555555555555;
      uVar4 = uVar4 + 1;
    } while (uVar5 <= uVar2 && uVar2 - uVar5 != 0);
  }
  std::__cxx11::stringbuf::str();
  DisplayConstraintGraph();
  return;
}

Assistant:

void cmComputeLinkDepends::DisplayConstraintGraph()
{
  // Display the graph nodes and their edges.
  std::ostringstream e;
  for (unsigned int i = 0; i < this->EntryConstraintGraph.size(); ++i) {
    EdgeList const& nl = this->EntryConstraintGraph[i];
    e << "item " << i << " is [" << this->EntryList[i].Item << "]\n";
    e << cmWrap("  item ", nl, " must follow it", "\n") << "\n";
  }
  fprintf(stderr, "%s\n", e.str().c_str());
}